

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

double __thiscall crnlib::symbol_histogram::calc_entropy(symbol_histogram *this)

{
  uint *puVar1;
  ulong uVar2;
  uint i;
  ulong uVar3;
  uint i_1;
  double dVar4;
  double dVar5;
  double dVar6;
  
  uVar2 = (ulong)(this->m_hist).m_size;
  puVar1 = (this->m_hist).m_p;
  dVar4 = 0.0;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar4 = dVar4 + (double)puVar1[uVar3];
  }
  dVar6 = 0.0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar6 = 0.0;
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      if (puVar1[uVar3] != 0) {
        dVar5 = log((double)puVar1[uVar3] * (1.0 / dVar4));
        puVar1 = (this->m_hist).m_p;
        dVar6 = dVar6 + (double)puVar1[uVar3] * dVar5 * -1.4426950216293335;
        uVar2 = (ulong)(this->m_hist).m_size;
      }
    }
  }
  return dVar6;
}

Assistant:

double symbol_histogram::calc_entropy() const {
  double total = 0.0f;
  for (uint i = 0; i < m_hist.size(); i++)
    total += m_hist[i];
  if (total == 0.0f)
    return 0.0f;

  double entropy = 0.0f;
  double neg_inv_log2 = -1.0f / log(2.0f);
  double inv_total = 1.0f / total;
  for (uint i = 0; i < m_hist.size(); i++) {
    if (m_hist[i]) {
      double bits = log(m_hist[i] * inv_total) * neg_inv_log2;
      entropy += bits * m_hist[i];
    }
  }

  return entropy;
}